

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

void __thiscall
Clasp::Asp::PrgBody::PrgBody
          (PrgBody *this,uint32 id,LogicProgram *prg,LitSpan *lits,uint32 pos,bool addDeps)

{
  Literal LVar1;
  Var VVar2;
  size_t x;
  int *piVar3;
  PrgBody **ppPVar4;
  PrgAtom *pPVar5;
  Span<int> *in_RCX;
  size_t *siglen;
  LogicProgram *in_RDX;
  uchar *sig;
  undefined4 in_ESI;
  EVP_PKEY_CTX *ctx;
  PrgBody *in_RDI;
  PrgBody *this_00;
  uchar *in_R8;
  size_t in_R9;
  Literal **n;
  iterator end;
  iterator it;
  Literal *p [2];
  Norm *c;
  bool in_stack_ffffffffffffff6b;
  uint32 in_stack_ffffffffffffff6c;
  PrgNode *in_stack_ffffffffffffff70;
  LogicProgram *this_01;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar6;
  int *local_50;
  PrgBody *local_48 [3];
  Body_t local_2c;
  byte local_25;
  uint local_24;
  Span<int> *local_20;
  LogicProgram *local_18;
  undefined4 local_c;
  
  local_24 = (uint)in_R8;
  local_25 = (byte)in_R9 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  PrgNode::PrgNode(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff6b);
  Potassco::Body_t::Body_t(&local_2c,Normal);
  x = Potassco::size<int>(local_20);
  toU32(x);
  init(in_RDI,(EVP_PKEY_CTX *)(ulong)local_2c.val_);
  this_00 = in_RDI + 1;
  Norm::Norm((Norm *)this_00);
  in_RDI->unsupp_ = local_24;
  local_48[1] = (PrgBody *)(&(this_00->super_PrgNode).field_0x0 + (ulong)local_24 * 4);
  local_48[0] = this_00;
  local_48[2] = this_00;
  local_50 = Potassco::begin<int>(local_20);
  piVar3 = Potassco::end<int>((Span<int> *)0x1a1bde);
  while( true ) {
    if (local_50 == piVar3) {
      return;
    }
    if (*local_50 == 0) break;
    ppPVar4 = local_48 + (*local_50 < 0);
    LVar1 = toLit(0x1a1c55);
    siglen = (size_t *)(ulong)LVar1.rep_;
    *(uint32 *)&(*ppPVar4)->super_PrgNode = LVar1.rep_;
    if ((local_25 & 1) != 0) {
      this_01 = local_18;
      VVar2 = Literal::var((Literal *)*ppPVar4);
      ctx = (EVP_PKEY_CTX *)(ulong)VVar2;
      pPVar5 = LogicProgram::getAtom(this_01,in_stack_ffffffffffffff6c);
      uVar6 = local_c;
      Literal::sign((Literal *)*ppPVar4,ctx,sig,siglen,in_R8,in_R9);
      PrgAtom::addDep((PrgAtom *)CONCAT44(uVar6,in_stack_ffffffffffffff80),
                      (Var)((ulong)pPVar5 >> 0x20),SUB81((ulong)pPVar5 >> 0x18,0));
    }
    *ppPVar4 = (PrgBody *)&((*ppPVar4)->super_PrgNode).field_0x4;
    local_50 = local_50 + 1;
  }
  Potassco::fail(-2,
                 "Clasp::Asp::PrgBody::PrgBody(uint32, LogicProgram &, const Potassco::LitSpan &, uint32, bool)"
                 ,0x29f,"*it != 0","body not simplified",0);
}

Assistant:

PrgBody::PrgBody(uint32 id, LogicProgram& prg, const Potassco::LitSpan& lits, uint32 pos, bool addDeps)
	: PrgNode(id, true) {
	init(Body_t::Normal, toU32(Potassco::size(lits)));
	Norm* c = new (data_)Norm();
	unsupp_ = pos;
	// store B+ followed by B-
	Literal* p[2] = {c->lits, c->lits + pos};
	for (Potassco::LitSpan::iterator it = Potassco::begin(lits), end = Potassco::end(lits); it != end; ++it) {
		POTASSCO_REQUIRE(*it != 0, "body not simplified");
		Literal*& n = p[*it < 0];
		*n = toLit(*it);
		if (addDeps) { prg.getAtom(n->var())->addDep(id, !n->sign()); }
		++n;
	}
}